

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_54(QPDF *pdf,char *arg2)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
  QPDF::getPDFVersion_abi_cxx11_();
  bVar1 = std::operator!=(&bStack_38,"1.5");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&bStack_38);
    QPDFWriter::setObjectStreamMode((qpdf_object_stream_e)&w);
    QPDFWriter::getFinalVersion_abi_cxx11_();
    bVar1 = std::operator!=(&bStack_38,"1.5");
    std::__cxx11::string::~string((string *)&bStack_38);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"oops: ");
      QPDFWriter::getFinalVersion_abi_cxx11_();
      poVar2 = std::operator<<(poVar2,(string *)&bStack_38);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&bStack_38);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
    return;
  }
  __assert_fail("pdf.getPDFVersion() != \"1.5\"",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x814,"void test_54(QPDF &, const char *)");
}

Assistant:

static void
test_54(QPDF& pdf, char const* arg2)
{
    // Test getFinalVersion. This must be invoked with a file
    // whose final version is not 1.5.
    QPDFWriter w(pdf, "a.pdf");
    assert(pdf.getPDFVersion() != "1.5");
    w.setObjectStreamMode(qpdf_o_generate);
    if (w.getFinalVersion() != "1.5") {
        std::cout << "oops: " << w.getFinalVersion() << std::endl;
    }
}